

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcherpp.hpp
# Opt level: O0

void __thiscall FileWatcherBase::~FileWatcherBase(FileWatcherBase *this)

{
  code *pcVar1;
  FileWatcherBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~FileWatcherBase() = default;